

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector4 Vector4Lerp(Vector4 v1,Vector4 v2,float amount)

{
  Vector4 VVar1;
  
  VVar1.y = (v2.y - v1.y) * amount + v1.y;
  VVar1.x = amount * (v2.x - v1.x) + v1.x;
  VVar1.w = (v2.w - v1.w) * amount + v1.w;
  VVar1.z = amount * (v2.z - v1.z) + v1.z;
  return VVar1;
}

Assistant:

RMAPI Vector4 Vector4Lerp(Vector4 v1, Vector4 v2, float amount)
{
    Vector4 result = { 0 };

    result.x = v1.x + amount*(v2.x - v1.x);
    result.y = v1.y + amount*(v2.y - v1.y);
    result.z = v1.z + amount*(v2.z - v1.z);
    result.w = v1.w + amount*(v2.w - v1.w);

    return result;
}